

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
               (DecimalCastData<duckdb::hugeint_t> *state,int32_t exponent)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  hugeint_t mod;
  hugeint_t local_50;
  hugeint_t local_40;
  
  uVar7 = 0;
  uVar4 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar4 = uVar7;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar7 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar4 - exponent == 0 || (int)uVar4 < exponent) {
      uVar7 = exponent - uVar4;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar4 - exponent);
    }
  }
  bVar2 = Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(state);
  if (bVar2) {
    bVar2 = uVar7 == 0;
    if ((int)uVar7 < 0) {
      lVar6 = (long)(int)uVar7;
      do {
        lVar6 = lVar6 + 1;
        hugeint_t::hugeint_t(&local_40,10);
        local_50 = hugeint_t::operator%(&state->result,&local_40);
        hugeint_t::hugeint_t(&local_40,-5);
        bVar3 = hugeint_t::operator<=(&local_50,&local_40);
        hugeint_t::hugeint_t(&local_40,10);
        hugeint_t::operator/=(&state->result,&local_40);
        hugeint_t::hugeint_t(&local_40,0);
        bVar2 = hugeint_t::operator==(&state->result,&local_40);
        if (bVar2) break;
      } while (lVar6 != 0);
      bVar2 = true;
      if (bVar3) {
        hugeint_t::hugeint_t(&local_50,1);
        hugeint_t::operator-=(&state->result,&local_50);
      }
    }
    else if ((!bVar2) &&
            (bVar3 = HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(state,'\0'), bVar3
            )) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (uVar7 == uVar5) break;
        bVar2 = HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(state,'\0');
        uVar1 = uVar5 + 1;
      } while (bVar2);
      bVar2 = uVar7 <= uVar5;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}